

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_stmt(SyntaxAnalyze *this)

{
  bool bVar1;
  SyntaxAnalyze *in_stack_00000060;
  JumpKind in_stack_00000084;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000088;
  LabelId in_stack_00000094;
  LabelId in_stack_00000098;
  JumpInstructionKind in_stack_0000009c;
  SyntaxAnalyze *in_stack_000000a0;
  SyntaxAnalyze *in_stack_000000b8;
  irGenerator *in_stack_ffffffffffffff28;
  SyntaxAnalyze *in_stack_ffffffffffffff30;
  Token in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  SyntaxAnalyze *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  if (bVar1) {
    gm_block(in_stack_ffffffffffffff30);
  }
  else {
    bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    if (bVar1) {
      gm_if_stmt(this);
    }
    else {
      bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                      );
      if (bVar1) {
        gm_while_stmt((SyntaxAnalyze *)0x2acd0d);
      }
      else {
        bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
        if (bVar1) {
          match_one_word(in_stack_000000a0,in_stack_0000009c);
          match_one_word(in_stack_000000a0,in_stack_0000009c);
          irGenerator::irGenerator::checkWhile(in_stack_ffffffffffffff28);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional();
          irGenerator::irGenerator::ir_jump
                    ((irGenerator *)in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                     in_stack_00000094,in_stack_00000088,in_stack_00000084);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2acdb7);
        }
        else {
          bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                           in_stack_ffffffffffffff38);
          if (bVar1) {
            match_one_word(in_stack_000000a0,in_stack_0000009c);
            match_one_word(in_stack_000000a0,in_stack_0000009c);
            irGenerator::irGenerator::checkWhile(in_stack_ffffffffffffff28);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional();
            irGenerator::irGenerator::ir_jump
                      ((irGenerator *)in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                       in_stack_00000094,in_stack_00000088,in_stack_00000084);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x2ace81);
          }
          else {
            bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                             in_stack_ffffffffffffff38);
            if (bVar1) {
              gm_return_stmt(in_stack_00000060);
            }
            else {
              bVar1 = find_word((SyntaxAnalyze *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (Token)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                (Token)in_stack_ffffffffffffff48);
              if (bVar1) {
                gm_assign_stmt(in_stack_00000060);
              }
              else {
                bVar1 = try_word(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                 in_stack_ffffffffffffff38);
                if (bVar1) {
                  match_one_word(in_stack_000000a0,in_stack_0000009c);
                }
                else {
                  gm_exp(in_stack_000000b8);
                  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                            ((shared_ptr<front::express::ExpressNode> *)0x2acf26);
                  match_one_word(in_stack_000000a0,in_stack_0000009c);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_stmt() {
  if (try_word(1, Token::LBRACE)) {
    gm_block();
  } else if (try_word(1, Token::IFTK)) {
    gm_if_stmt();
  } else if (try_word(1, Token::WHILETK)) {
    gm_while_stmt();
  } else if (try_word(1, Token::BREAK)) {
    match_one_word(Token::BREAK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._endLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::CONTINUETK)) {
    match_one_word(Token::CONTINUETK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._beginLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::RETURNTK)) {
    gm_return_stmt();
  } else if (find_word(Token::ASSIGN, Token::SEMICN)) {
    gm_assign_stmt();
  } else if (!try_word(1, Token::SEMICN)) {
    gm_exp();
    match_one_word(Token::SEMICN);
  } else {
    match_one_word(Token::SEMICN);
  }
}